

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCov.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_dadb::CCov::addCoverageTraceCall
          (CCov *this,Instruction *Inst,FunctionCallee CoverageFunction)

{
  uint uVar1;
  StringRef Str;
  StringRef Str_00;
  uint uVar2;
  long lVar3;
  Constant *pCVar4;
  IntegerType *pIVar5;
  ArrayRef<llvm::Value_*> Args_00;
  undefined1 auVar6 [16];
  string FileNameStr;
  array<llvm::Value_*,_4UL> Args;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> Builder;
  char *local_128;
  size_t local_120;
  char local_118;
  undefined7 uStack_117;
  FunctionType *local_108;
  Constant *local_100;
  Constant *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  Twine local_e0;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> local_b8;
  
  local_108 = CoverageFunction.FnTy;
  uVar2 = 0;
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            (&local_b8,Inst,(MDNode *)0x0,
             (ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>)ZEXT816(0));
  if (this->FileName == (Constant *)0x0) {
    lVar3 = llvm::Instruction::getModule();
    local_128 = &local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,*(long *)(lVar3 + 0xd0),
               *(long *)(lVar3 + 0xd8) + *(long *)(lVar3 + 0xd0));
    Str.Length = local_120;
    Str.Data = local_128;
    llvm::Twine::Twine(&local_e0,"");
    pCVar4 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       (&local_b8.super_IRBuilderBase,Str,&local_e0,0,(Module *)0x0);
    this->FileName = pCVar4;
    if (local_128 != &local_118) {
      operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
    }
  }
  if (this->FunctionName == (Constant *)0x0) {
    llvm::Instruction::getFunction();
    auVar6 = llvm::Value::getName();
    lVar3 = auVar6._0_8_;
    if (lVar3 == 0) {
      local_128 = &local_118;
      local_120 = 0;
      local_118 = '\0';
    }
    else {
      local_128 = &local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,lVar3,auVar6._8_8_ + lVar3);
    }
    Str_00.Length = local_120;
    Str_00.Data = local_128;
    llvm::Twine::Twine(&local_e0,"");
    pCVar4 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       (&local_b8.super_IRBuilderBase,Str_00,&local_e0,0,(Module *)0x0);
    this->FunctionName = pCVar4;
    if (local_128 != &local_118) {
      operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
    }
    uVar2 = 1;
  }
  uVar1 = uVar2 + 2;
  if (Inst[0x10] != (Instruction)0x1c) {
    uVar1 = uVar2;
  }
  local_100 = this->FileName;
  local_f8 = this->FunctionName;
  uVar2 = llvm::DebugLoc::getLine();
  pIVar5 = (IntegerType *)llvm::Type::getInt32Ty(local_b8.super_IRBuilderBase.Context);
  local_f0 = llvm::ConstantInt::get(pIVar5,(ulong)uVar2,false);
  pIVar5 = (IntegerType *)llvm::Type::getInt32Ty(local_b8.super_IRBuilderBase.Context);
  local_e8 = llvm::ConstantInt::get(pIVar5,(ulong)uVar1,false);
  llvm::Twine::Twine(&local_e0,"");
  Args_00.Length = 4;
  Args_00.Data = (Value **)&local_100;
  llvm::IRBuilderBase::CreateCall
            (&local_b8.super_IRBuilderBase,local_108,CoverageFunction.Callee,Args_00,&local_e0,
             (MDNode *)0x0);
  llvm::IRBuilderDefaultInserter::~IRBuilderDefaultInserter(&local_b8.Inserter);
  llvm::IRBuilderFolder::~IRBuilderFolder((IRBuilderFolder *)&local_b8.Folder);
  if ((SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U> *)
      local_b8.super_IRBuilderBase.MetadataToCopy.
      super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
      super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
      super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX !=
      &local_b8.super_IRBuilderBase.MetadataToCopy.
       super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>) {
    free(local_b8.super_IRBuilderBase.MetadataToCopy.
         super_SmallVectorImpl<std::pair<unsigned_int,_llvm::MDNode_*>_>.
         super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::MDNode_*>,_true>.
         super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::MDNode_*>,_void>.
         super_SmallVectorBase<unsigned_int>.BeginX);
  }
  return;
}

Assistant:

void CCov::addCoverageTraceCall(Instruction *Inst,
    FunctionCallee CoverageFunction) {
  IRBuilder<> Builder(Inst);
  const DebugLoc &Loc = Inst->getDebugLoc();
  std::array<Value *, 4> Args;
  uint32_t Attribute = 0;
  if (!FileName) {
    std::string FileNameStr = Inst->getModule()->getSourceFileName();
    FileName = Builder.CreateGlobalStringPtr(FileNameStr);
  }
  if (!FunctionName) {
    std::string FunctionNameStr = Inst->getFunction()->getName().str();
    FunctionName = Builder.CreateGlobalStringPtr(FunctionNameStr);
    Attribute |= CCov_Entry;
  }
  if (Inst->getOpcode() == Instruction::Ret)
    Attribute |= CCov_Ret;
  Args[0] = FileName;
  Args[1] = FunctionName;
  Args[2] = Builder.getInt32((uint32_t)Loc.getLine());
  Args[3] = Builder.getInt32(Attribute);
  Builder.CreateCall(CoverageFunction, ArrayRef<Value *>(Args));
}